

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlNewDocRawNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlNodePtr cur;
  xmlNodePtr pxVar1;
  xmlNodePtr pxVar2;
  
  cur = xmlNewDocNode(doc,ns,name,(xmlChar *)0x0);
  pxVar2 = (xmlNodePtr)0x0;
  if ((cur != (xmlNodePtr)0x0) && (cur->doc = doc, pxVar2 = cur, content != (xmlChar *)0x0)) {
    pxVar1 = xmlNewText(content);
    if (pxVar1 == (xmlNodePtr)0x0) {
      xmlFreeNode(cur);
      pxVar2 = (xmlNodePtr)0x0;
    }
    else {
      pxVar1->doc = doc;
      cur->children = pxVar1;
      cur->last = pxVar1;
      pxVar1->parent = cur;
    }
  }
  return pxVar2;
}

Assistant:

xmlNodePtr
xmlNewDocRawNode(xmlDocPtr doc, xmlNsPtr ns,
                 const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewDocNode(doc, ns, name, NULL);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
            xmlNodePtr text;

	    text = xmlNewDocText(doc, content);
            if (text == NULL) {
                xmlFreeNode(cur);
                return(NULL);
            }

            cur->children = text;
            cur->last = text;
            text->parent = cur;
	}
    }
    return(cur);
}